

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O2

int cgltf_parse_json_vec3
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,float **out_array,
              cgltf_size *out_size)

{
  jsmntok_t *tok;
  int iVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  cgltf_float cVar6;
  ulong local_50;
  
  if (tokens[i].type == JSMN_OBJECT) {
    iVar3 = tokens[i].size;
    if ((iVar3 < 3) || (*out_array != (float *)0x0)) {
      iVar4 = -1;
    }
    else {
      pfVar2 = (float *)(*(options->memory).alloc)((options->memory).user_data,0xc);
      if (pfVar2 == (float *)0x0) {
        *out_array = (float *)0x0;
        iVar4 = -2;
      }
      else {
        pfVar2[2] = 0.0;
        pfVar2[0] = 0.0;
        pfVar2[1] = 0.0;
        iVar4 = i + 1;
        *out_array = pfVar2;
        local_50 = 0;
        do {
          do {
            bVar5 = iVar3 == 0;
            iVar3 = iVar3 + -1;
            if (bVar5) {
              if (local_50 < 3) {
                return -1;
              }
              *out_size = local_50;
              return iVar4;
            }
          } while ((tokens[iVar4].type != JSMN_STRING) || (tok = tokens + iVar4, tok->size == 0));
          iVar1 = cgltf_json_strcmp(tok,json_chunk,"x");
          if (iVar1 == 0) {
            cVar6 = cgltf_json_to_float(tokens + (long)iVar4 + 1,json_chunk);
            *pfVar2 = cVar6;
LAB_0011701d:
            iVar4 = iVar4 + 2;
            local_50 = local_50 + 1;
          }
          else {
            iVar1 = cgltf_json_strcmp(tok,json_chunk,"y");
            if (iVar1 == 0) {
              cVar6 = cgltf_json_to_float(tokens + (long)iVar4 + 1,json_chunk);
              pfVar2[1] = cVar6;
              goto LAB_0011701d;
            }
            iVar1 = cgltf_json_strcmp(tok,json_chunk,"z");
            if (iVar1 == 0) {
              cVar6 = cgltf_json_to_float(tokens + (long)iVar4 + 1,json_chunk);
              pfVar2[2] = cVar6;
              goto LAB_0011701d;
            }
            iVar4 = cgltf_skip_json(tokens,iVar4 + 1);
          }
        } while (-1 < iVar4);
      }
    }
  }
  else {
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

static int cgltf_parse_json_vec3(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, float** out_array, cgltf_size* out_size)
{
	if (tokens[i].type == JSMN_OBJECT) {
		int size = tokens[i].size; ++i;
		if (size < 3) {
			return CGLTF_ERROR_JSON;
		}
		else {
			if (*out_array) {
				return CGLTF_ERROR_JSON;
			}
			*out_array = (float*)cgltf_calloc(options, sizeof(cgltf_float), 3);
			if (!*out_array)
			{
				return CGLTF_ERROR_NOMEM;
			}
		}

		cgltf_size count = 0;
		for (int j = 0; j < size; ++j) {
			if (tokens[i].type != JSMN_STRING || tokens[i].size == 0) {
				continue;
			}
			else if (cgltf_json_strcmp(tokens + i, json_chunk, "x") == 0) {
				++i; (*out_array)[0] = cgltf_json_to_float(tokens + i, json_chunk); ++i;
				++count;
			}
			else if (cgltf_json_strcmp(tokens + i, json_chunk, "y") == 0) {
				++i; (*out_array)[1] = cgltf_json_to_float(tokens + i, json_chunk); ++i;
				++count;
			}
			else if (cgltf_json_strcmp(tokens + i, json_chunk, "z") == 0) {
				++i; (*out_array)[2] = cgltf_json_to_float(tokens + i, json_chunk); ++i;
				++count;
			}
			else {
				i = cgltf_skip_json(tokens, i + 1);
			}
			if (i < 0) return i;
		}
		if (count < 3) {
			return CGLTF_ERROR_JSON;
		}
		*out_size = count;
	}
	else {
		return CGLTF_ERROR_JSON;
	}
	return i;
}